

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O3

int secp256k1_ecmult_multi_var
              (secp256k1_callback *error_callback,secp256k1_scratch *scratch,secp256k1_gej *r,
              secp256k1_scalar *inp_g_sc,secp256k1_ecmult_multi_callback *cb,void *cbdata,size_t n)

{
  int iVar1;
  size_t sVar2;
  ulong uVar3;
  code *pcVar4;
  secp256k1_scalar *psVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong local_868;
  secp256k1_strauss_state local_860;
  secp256k1_fe aux [8];
  secp256k1_strauss_point_state ps [1];
  secp256k1_ge pre_a [8];
  
  r->infinity = 1;
  (r->x).n[0] = 0;
  (r->x).n[1] = 0;
  (r->x).n[2] = 0;
  (r->x).n[3] = 0;
  (r->x).n[4] = 0;
  (r->y).n[0] = 0;
  (r->y).n[1] = 0;
  (r->y).n[2] = 0;
  (r->y).n[3] = 0;
  (r->y).n[4] = 0;
  (r->z).n[0] = 0;
  (r->z).n[1] = 0;
  (r->z).n[2] = 0;
  (r->z).n[3] = 0;
  (r->z).n[4] = 0;
  if (inp_g_sc != (secp256k1_scalar *)0x0 || n != 0) {
    if (n != 0) {
      if ((scratch != (secp256k1_scratch *)0x0) &&
         (sVar2 = secp256k1_pippenger_max_points(error_callback,scratch), sVar2 != 0)) {
        uVar3 = 5000000;
        if (sVar2 < 5000000) {
          uVar3 = sVar2;
        }
        uVar8 = n - 1;
        local_868 = uVar8 / uVar3 + 1;
        uVar3 = uVar8 / local_868;
        if (uVar3 < 0x57) {
          lVar7 = 0;
          do {
            if (scratch->magic[lVar7] != "scratch"[lVar7]) {
              (*error_callback->fn)("invalid scratch space",error_callback->data);
              goto LAB_0016396f;
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 != 8);
          uVar6 = scratch->max_size - scratch->alloc_size;
          uVar3 = 0;
          if (0x4a < uVar6) {
            uVar3 = uVar6 - 0x4b;
          }
          if (uVar3 < 0x8b0) goto LAB_0016396f;
          uVar3 = uVar3 / 0x8b0;
          if (4999999 < uVar3) {
            uVar3 = 5000000;
          }
          local_868 = uVar8 / uVar3 + 1;
          uVar3 = uVar8 / local_868;
          pcVar4 = secp256k1_ecmult_strauss_batch;
        }
        else {
          pcVar4 = secp256k1_ecmult_pippenger_batch;
        }
        uVar3 = uVar3 + 1;
        lVar7 = 0;
        uVar8 = 0;
        while( true ) {
          uVar6 = uVar3;
          if (n < uVar3) {
            uVar6 = n;
          }
          psVar5 = (secp256k1_scalar *)0x0;
          if (uVar8 == 0) {
            psVar5 = inp_g_sc;
          }
          iVar1 = (*pcVar4)(error_callback,scratch,ps,psVar5,cb,cbdata,uVar6,lVar7);
          if (iVar1 == 0) break;
          secp256k1_gej_add_var(r,r,(secp256k1_gej *)ps,(secp256k1_fe *)0x0);
          n = n - uVar6;
          uVar8 = uVar8 + 1;
          lVar7 = lVar7 + uVar3;
          if (local_868 == uVar8) {
            return 1;
          }
        }
        return 0;
      }
LAB_0016396f:
      iVar1 = secp256k1_ecmult_multi_simple_var(r,inp_g_sc,cb,cbdata,n);
      return iVar1;
    }
    local_860.aux = aux;
    local_860.pre_a = pre_a;
    local_860.ps = ps;
    secp256k1_ecmult_strauss_wnaf(&local_860,r,1,r,&secp256k1_scalar_zero,inp_g_sc);
  }
  return 1;
}

Assistant:

static int secp256k1_ecmult_multi_var(const secp256k1_callback* error_callback, secp256k1_scratch *scratch, secp256k1_gej *r, const secp256k1_scalar *inp_g_sc, secp256k1_ecmult_multi_callback cb, void *cbdata, size_t n) {
    size_t i;

    int (*f)(const secp256k1_callback* error_callback, secp256k1_scratch*, secp256k1_gej*, const secp256k1_scalar*, secp256k1_ecmult_multi_callback cb, void*, size_t, size_t);
    size_t n_batches;
    size_t n_batch_points;

    secp256k1_gej_set_infinity(r);
    if (inp_g_sc == NULL && n == 0) {
        return 1;
    } else if (n == 0) {
        secp256k1_ecmult(r, r, &secp256k1_scalar_zero, inp_g_sc);
        return 1;
    }
    if (scratch == NULL) {
        return secp256k1_ecmult_multi_simple_var(r, inp_g_sc, cb, cbdata, n);
    }

    /* Compute the batch sizes for Pippenger's algorithm given a scratch space. If it's greater than
     * a threshold use Pippenger's algorithm. Otherwise use Strauss' algorithm.
     * As a first step check if there's enough space for Pippenger's algo (which requires less space
     * than Strauss' algo) and if not, use the simple algorithm. */
    if (!secp256k1_ecmult_multi_batch_size_helper(&n_batches, &n_batch_points, secp256k1_pippenger_max_points(error_callback, scratch), n)) {
        return secp256k1_ecmult_multi_simple_var(r, inp_g_sc, cb, cbdata, n);
    }
    if (n_batch_points >= ECMULT_PIPPENGER_THRESHOLD) {
        f = secp256k1_ecmult_pippenger_batch;
    } else {
        if (!secp256k1_ecmult_multi_batch_size_helper(&n_batches, &n_batch_points, secp256k1_strauss_max_points(error_callback, scratch), n)) {
            return secp256k1_ecmult_multi_simple_var(r, inp_g_sc, cb, cbdata, n);
        }
        f = secp256k1_ecmult_strauss_batch;
    }
    for(i = 0; i < n_batches; i++) {
        size_t nbp = n < n_batch_points ? n : n_batch_points;
        size_t offset = n_batch_points*i;
        secp256k1_gej tmp;
        if (!f(error_callback, scratch, &tmp, i == 0 ? inp_g_sc : NULL, cb, cbdata, nbp, offset)) {
            return 0;
        }
        secp256k1_gej_add_var(r, r, &tmp, NULL);
        n -= nbp;
    }
    return 1;
}